

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

int bcm2835_spi_begin(void)

{
  uint32_t *puVar1;
  
  if (bcm2835_spi0 != (uint32_t *)0xffffffffffffffff) {
    bcm2835_peri_set_bits(bcm2835_gpio,0x800000,0xe00000);
    bcm2835_peri_set_bits(bcm2835_gpio,0x4000000,0x7000000);
    bcm2835_peri_set_bits(bcm2835_gpio,0x20000000,0x38000000);
    bcm2835_peri_set_bits(bcm2835_gpio + 1,4,7);
    bcm2835_peri_set_bits(bcm2835_gpio + 1,0x20,0x38);
    puVar1 = bcm2835_spi0;
    if (debug == '\0') {
      *bcm2835_spi0 = 0;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_spi0,0);
    }
    if (debug == '\0') {
      *puVar1 = 0x30;
    }
    else {
      printf("bcm2835_peri_write_nb paddr %p, value %08X\n",puVar1,0x30);
    }
    return 1;
  }
  return 0;
}

Assistant:

int bcm2835_spi_begin(void)
{
    volatile uint32_t* paddr;

    if (bcm2835_spi0 == MAP_FAILED)
      return 0; /* bcm2835_init() failed, or not root */
    
    /* Set the SPI0 pins to the Alt 0 function to enable SPI0 access on them */
    bcm2835_gpio_fsel(RPI_GPIO_P1_26, BCM2835_GPIO_FSEL_ALT0); /* CE1 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_24, BCM2835_GPIO_FSEL_ALT0); /* CE0 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_21, BCM2835_GPIO_FSEL_ALT0); /* MISO */
    bcm2835_gpio_fsel(RPI_GPIO_P1_19, BCM2835_GPIO_FSEL_ALT0); /* MOSI */
    bcm2835_gpio_fsel(RPI_GPIO_P1_23, BCM2835_GPIO_FSEL_ALT0); /* CLK */
    
    /* Set the SPI CS register to the some sensible defaults */
    paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    bcm2835_peri_write(paddr, 0); /* All 0s */
    
    /* Clear TX and RX fifos */
    bcm2835_peri_write_nb(paddr, BCM2835_SPI0_CS_CLEAR);

    return 1; // OK
}